

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
booster::locale::basic_format<char>::format_output
          (basic_format<char> *this,stream_type *out,string_type *sformat)

{
  pointer pcVar1;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  formattible_type fVar8;
  format_guard guard;
  format_parser fmt;
  undefined1 local_a0 [16];
  string_type value;
  string svalue;
  string key;
  
  pcVar1 = (sformat->_M_dataplus)._M_p;
  uVar2 = sformat->_M_string_length;
  uVar7 = 0;
LAB_00119893:
  do {
    for (; cVar4 = pcVar1[uVar7], cVar4 == '{'; uVar7 = uVar7 + 2) {
      uVar6 = uVar7 + 1;
      if ((uVar2 <= uVar6) || (pcVar1[uVar6] != '{')) {
        booster::locale::details::format_parser::format_parser
                  (&fmt,(ios_base *)(out + *(long *)(*(long *)out + -0x18)),out,imbue_locale);
        guard.restored_ = false;
        guard.fmt_ = &fmt;
LAB_0011991c:
        if (uVar6 < uVar2) {
          key._M_dataplus._M_p = (pointer)&key.field_2;
          key._M_string_length = 0;
          svalue._M_dataplus._M_p = (pointer)&svalue.field_2;
          svalue._M_string_length = 0;
          key.field_2._M_local_buf[0] = '\0';
          svalue.field_2._M_local_buf[0] = '\0';
          value._M_dataplus._M_p = (pointer)&value.field_2;
          value._M_string_length = 0;
          value.field_2._M_local_buf[0] = '\0';
          for (; (cVar4 = pcVar1[uVar6], cVar4 != '\0' && (cVar4 != ',')); uVar6 = uVar6 + 1) {
            if (cVar4 == '=') {
              cVar4 = pcVar1[uVar6 + 1];
              uVar7 = uVar6;
              if (cVar4 != '\'') goto LAB_001199f3;
              uVar6 = uVar6 + 2;
              goto LAB_001199b2;
            }
            if (cVar4 == '}') break;
            std::__cxx11::string::push_back((char)&key);
          }
          goto LAB_00119a19;
        }
        goto LAB_00119abf;
      }
      cVar4 = '{';
LAB_001198e4:
      std::operator<<(out,cVar4);
    }
    if (cVar4 == '}') {
      if (pcVar1[uVar7 + 1] == '}') {
        cVar4 = '}';
        goto LAB_001198e4;
      }
    }
    else if (cVar4 == '\0') {
      return;
    }
    std::operator<<(out,cVar4);
    uVar7 = uVar7 + 1;
  } while( true );
LAB_001199f3:
  while (((uVar6 = uVar7 + 1, cVar4 != '\0' && (cVar4 != ',')) && (cVar4 != '}'))) {
    std::__cxx11::string::push_back((char)&svalue);
    cVar4 = pcVar1[uVar7 + 2];
    uVar7 = uVar6;
  }
LAB_00119a19:
  booster::locale::details::format_parser::set_one_flag((string *)&fmt,(string *)&key);
LAB_00119a29:
  if (pcVar1[uVar6] == '}') {
    booster::locale::details::format_parser::get_position();
    fVar8 = get((basic_format<char> *)local_a0,(uint)this);
    (*(code *)local_a0._8_8_)(out,local_a0._0_8_,fVar8.writer_);
    format_guard::restore(&guard);
    uVar6 = uVar6 + 1;
  }
  else {
    if (pcVar1[uVar6] == ',') {
      uVar6 = uVar6 + 1;
      bVar3 = true;
      goto LAB_00119a84;
    }
    format_guard::restore(&guard);
  }
  bVar3 = false;
LAB_00119a84:
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)&svalue);
  std::__cxx11::string::~string((string *)&key);
  if (!bVar3) goto LAB_00119abf;
  goto LAB_0011991c;
LAB_001199b2:
  cVar4 = (char)&value;
  if (pcVar1[uVar6] != '\'') {
    if (pcVar1[uVar6] == '\0') goto LAB_00119aaa;
    std::__cxx11::string::push_back(cVar4);
    lVar5 = 1;
LAB_001199ee:
    uVar6 = uVar6 + lVar5;
    goto LAB_001199b2;
  }
  if (pcVar1[uVar6 + 1] == '\'') {
    std::__cxx11::string::push_back(cVar4);
    lVar5 = 2;
    goto LAB_001199ee;
  }
  uVar6 = uVar6 + 1;
LAB_00119aaa:
  details::format_parser::set_flag_with_str<char>(&fmt,&key,&value);
  goto LAB_00119a29;
LAB_00119abf:
  format_guard::~format_guard(&guard);
  booster::locale::details::format_parser::~format_parser(&fmt);
  uVar7 = uVar6;
  goto LAB_00119893;
}

Assistant:

void format_output(stream_type &out,string_type const &sformat) const
            {
                char_type obrk='{';
                char_type cbrk='}';
                char_type eq='=';
                char_type comma=',';
                char_type quote='\'';

                size_t pos = 0;
                size_t size=sformat.size();
                CharType const *format=sformat.c_str();
                while(format[pos]!=0) {
                    if(format[pos] != obrk) {
                        if(format[pos]==cbrk && format[pos+1]==cbrk) {
                            out << cbrk;
                            pos+=2;
                        }
                        else {
                            out<<format[pos];
                            pos++;
                        }
                        continue;
                    }

                    if(pos+1 < size && format[pos+1]==obrk) {
                        out << obrk;
                        pos+=2;
                        continue;
                    }
                    pos++;
                  
                    details::format_parser fmt(out,static_cast<void *>(&out),&basic_format::imbue_locale);

                    format_guard guard(fmt);

                    while(pos < size) { 
                        std::string key;
                        std::string svalue;
                        string_type value;
                        bool use_svalue = true;
                        for(;format[pos];pos++) {
                            char_type c=format[pos];
                            if(c==comma || c==eq || c==cbrk)
                                break;
                            else {
                                key+=static_cast<char>(c);
                            }
                        }

                        if(format[pos]==eq) {
                            pos++;
                            if(format[pos]==quote) {
                                pos++;
                                use_svalue = false;
                                while(format[pos]) {
                                    if(format[pos]==quote) {
                                        if(format[pos+1]==quote) {
                                            value+=quote;
                                            pos+=2;
                                        }
                                        else {
                                            pos++;
                                            break;
                                        }
                                    }
                                    else {
                                        value+=format[pos];
                                        pos++;
                                    }
                                }
                            }
                            else {
                                char_type c;
                                while((c=format[pos])!=0 && c!=comma && c!=cbrk) {
                                    svalue+=static_cast<char>(c);
                                    pos++;
                                }
                            }
                        }

                        if(use_svalue) {
                            fmt.set_one_flag(key,svalue);
                        }
                        else 
                            fmt.set_flag_with_str(key,value);
                        
                        if(format[pos]==comma) {
                            pos++;
                            continue;
                        }
                        else if(format[pos]==cbrk)  {
                            unsigned position = fmt.get_position();
                            out << get(position);
                            guard.restore();
                            pos++;
                            break;
                        }
                        else {                        
                            guard.restore();
                            break;
                        }
                    }
                }
            }